

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfc.cpp
# Opt level: O3

int __thiscall NfcFilter::init(NfcFilter *this,EVP_PKEY_CTX *ctx)

{
  undefined1 auVar1 [16];
  float in_XMM0_Da;
  float fVar2;
  undefined4 in_XMM0_Db;
  float fVar3;
  float fVar8;
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar5 [16];
  
  fVar2 = in_XMM0_Da * 0.5;
  fVar3 = 1.0 / (fVar2 + 1.0);
  (this->first).base_gain = fVar3;
  (this->first).gain = fVar3;
  (this->first).b1 = 0.0;
  (this->first).a1 = (fVar2 + fVar2) / (fVar2 + 1.0);
  (this->first).z[0] = 0.0;
  fVar3 = fVar2 * 3.0;
  fVar11 = fVar3 + 1.0 + fVar2 * fVar3;
  fVar9 = fVar2 * fVar3 * 4.0;
  auVar4._0_4_ = fVar3 + fVar3 + fVar9;
  (this->second).base_gain = 1.0 / fVar11;
  (this->second).gain = 1.0 / fVar11;
  auVar5._4_8_ = 0;
  auVar5._0_4_ = auVar4._0_4_;
  auVar5._12_4_ = in_XMM0_Db;
  auVar4._8_8_ = auVar5._8_8_;
  auVar4._4_4_ = fVar9;
  auVar1._4_4_ = fVar11;
  auVar1._0_4_ = fVar11;
  auVar1._8_8_ = 0;
  auVar6 = divps(auVar4,auVar1);
  (this->second).b1 = 0.0;
  (this->second).b2 = 0.0;
  (this->second).a1 = (float)(int)auVar6._0_8_;
  (this->second).a2 = (float)(int)((ulong)auVar6._0_8_ >> 0x20);
  (this->second).z[0] = 0.0;
  (this->second).z[1] = 0.0;
  fVar3 = fVar2 * 3.6778;
  fVar11 = fVar2 * 6.4595 * fVar2;
  fVar9 = fVar2 * 2.3222;
  auVar12._0_4_ = fVar3 + 1.0 + fVar11;
  fVar14 = 1.0 / ((fVar9 + 1.0) * auVar12._0_4_);
  fVar11 = fVar11 * 4.0;
  auVar7._0_4_ = fVar3 + fVar3 + fVar11;
  (this->third).base_gain = fVar14;
  (this->third).gain = fVar14;
  (this->third).b1 = 0.0;
  (this->third).b2 = 0.0;
  (this->third).b3 = 0.0;
  auVar7._4_4_ = fVar11;
  auVar7._8_8_ = 0;
  auVar12._4_4_ = auVar12._0_4_;
  auVar12._8_8_ = 0;
  auVar6 = divps(auVar7,auVar12);
  (this->third).a1 = (float)(int)auVar6._0_8_;
  (this->third).a2 = (float)(int)((ulong)auVar6._0_8_ >> 0x20);
  (this->third).a3 = (fVar9 + fVar9) / (fVar9 + 1.0);
  (this->third).z[2] = 0.0;
  (this->third).z[0] = 0.0;
  (this->third).z[1] = 0.0;
  (this->fourth).b1 = 0.0;
  (this->fourth).b2 = 0.0;
  (this->fourth).b3 = 0.0;
  (this->fourth).b4 = 0.0;
  fVar14 = fVar2 * 4.2076;
  fVar8 = fVar2 * 5.7924;
  fVar10 = fVar2 * 11.4877 * fVar2;
  fVar2 = fVar2 * 9.1401 * fVar2;
  fVar3 = fVar14 + 1.0 + fVar10;
  fVar9 = fVar8 + 1.0 + fVar2;
  fVar11 = 1.0 / (fVar9 * fVar3);
  fVar10 = fVar10 * 4.0;
  auVar13._0_4_ = fVar14 + fVar14 + fVar10;
  fVar2 = fVar2 * 4.0;
  auVar13._4_4_ = fVar10;
  auVar13._12_4_ = fVar2;
  auVar13._8_4_ = fVar8 + fVar8 + fVar2;
  auVar6._4_4_ = fVar3;
  auVar6._0_4_ = fVar3;
  auVar6._8_4_ = fVar9;
  auVar6._12_4_ = fVar9;
  auVar6 = divps(auVar13,auVar6);
  (this->fourth).base_gain = fVar11;
  (this->fourth).gain = fVar11;
  (this->fourth).a1 = (float)auVar6._0_4_;
  (this->fourth).a2 = (float)auVar6._4_4_;
  (this->fourth).a3 = (float)auVar6._8_4_;
  (this->fourth).a4 = (float)auVar6._12_4_;
  (this->fourth).z[0] = 0.0;
  (this->fourth).z[1] = 0.0;
  (this->fourth).z[2] = 0.0;
  (this->fourth).z[3] = 0.0;
  return 0;
}

Assistant:

NfcFilter1 NfcFilterCreate1(const float w0, const float w1) noexcept
{
    NfcFilter1 nfc{};
    float b_00, g_0;
    float r;

    nfc.base_gain = 1.0f;
    nfc.gain = 1.0f;

    /* Calculate bass-boost coefficients. */
    r = 0.5f * w0;
    b_00 = B[1][0] * r;
    g_0 = 1.0f + b_00;

    nfc.gain *= g_0;
    nfc.b1 = 2.0f * b_00 / g_0;

    /* Calculate bass-cut coefficients. */
    r = 0.5f * w1;
    b_00 = B[1][0] * r;
    g_0 = 1.0f + b_00;

    nfc.base_gain /= g_0;
    nfc.gain /= g_0;
    nfc.a1 = 2.0f * b_00 / g_0;

    return nfc;
}